

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O2

void BinaryenAtomicRMWSetValue(BinaryenExpressionRef expr,BinaryenExpressionRef valueExpr)

{
  if (expr->_id != AtomicRMWId) {
    __assert_fail("expression->is<AtomicRMW>()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                  ,0xbb1,
                  "void BinaryenAtomicRMWSetValue(BinaryenExpressionRef, BinaryenExpressionRef)");
  }
  if (valueExpr != (BinaryenExpressionRef)0x0) {
    expr[2].type.id = (uintptr_t)valueExpr;
    return;
  }
  __assert_fail("valueExpr",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                ,0xbb2,
                "void BinaryenAtomicRMWSetValue(BinaryenExpressionRef, BinaryenExpressionRef)");
}

Assistant:

void BinaryenAtomicRMWSetValue(BinaryenExpressionRef expr,
                               BinaryenExpressionRef valueExpr) {
  auto* expression = (Expression*)expr;
  assert(expression->is<AtomicRMW>());
  assert(valueExpr);
  static_cast<AtomicRMW*>(expression)->value = (Expression*)valueExpr;
}